

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O2

void test_normc<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *orig,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *normal,norm_type type)

{
  int iVar1;
  wchar_t *begin;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  runtime_error *prVar5;
  allocator local_59;
  generator local_58 [8];
  locale l;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  booster::locale::generator::generator(local_58);
  std::__cxx11::string::string((string *)&local_48,"en_US.UTF-8",&local_59);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)&local_48);
  booster::locale::generator::~generator(local_58);
  test_counter = test_counter + 1;
  booster::locale::normalize<wchar_t>(&local_48,orig,type,&l);
  _Var3 = std::operator==(&local_48,normal);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1b);
    poVar4 = std::operator<<(poVar4," normalize(orig,type,l)==normal");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_48,"Error limits reached, stopping unit test",
                 (allocator *)local_58);
      booster::runtime_error::runtime_error(prVar5,(string *)&local_48);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::normalize<wchar_t>(&local_48,(orig->_M_dataplus)._M_p,type,&l);
  _Var3 = std::operator==(&local_48,normal);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1c);
    poVar4 = std::operator<<(poVar4," normalize(orig.c_str(),type,l)==normal");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_48,"Error limits reached, stopping unit test",
                 (allocator *)local_58);
      booster::runtime_error::runtime_error(prVar5,(string *)&local_48);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  begin = (orig->_M_dataplus)._M_p;
  booster::locale::normalize<wchar_t>(&local_48,begin,begin + orig->_M_string_length,type,&l);
  _Var3 = std::operator==(&local_48,normal);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1d);
    poVar4 = std::operator<<(poVar4,
                             " normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_48,"Error limits reached, stopping unit test",
                 (allocator *)local_58);
      booster::runtime_error::runtime_error(prVar5,(string *)&local_48);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale(&l);
  return;
}

Assistant:

void test_normc(std::basic_string<Char> orig,std::basic_string<Char> normal,booster::locale::norm_type type)
{
    std::locale l = booster::locale::generator().generate("en_US.UTF-8");
    TEST(normalize(orig,type,l)==normal);
    TEST(normalize(orig.c_str(),type,l)==normal);
    TEST(normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal);
}